

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O3

bool aedit_climate(CHAR_DATA *ch,char *argument)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string buffer;
  char wcli [4608];
  char hold [4608];
  long *local_26b0 [2];
  long local_26a0 [2];
  char *local_2690;
  undefined8 local_2688;
  char local_2680;
  undefined7 uStack_267f;
  _func_int **local_2670;
  char *local_2668 [3];
  buffer<char> local_2650;
  char local_2630 [504];
  char local_2438 [4608];
  char local_1238 [4616];
  
  local_2690 = &local_2680;
  local_2688 = 0;
  local_2680 = '\0';
  pvVar1 = ch->desc->pEdit;
  one_argument(argument,local_2438);
  iVar2 = aclimate_lookup(local_2438);
  if (iVar2 < 0) {
    local_2650.ptr_ = local_2630;
    local_2650.size_ = 0;
    local_2670 = (_func_int **)&PTR_grow_0044b3a0;
    local_2650._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
    local_2650.capacity_ = 500;
    fmt.size_ = 0x1c;
    fmt.data_ = "{} is not a valid climate.\n\r";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_2668;
    args.desc_ = 0xc;
    local_2668[0] = local_2438;
    ::fmt::v9::detail::vformat_to<char>(&local_2650,fmt,args,(locale_ref)0x0);
    local_26b0[0] = local_26a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_26b0,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
    if (local_2650.ptr_ != local_2630) {
      operator_delete(local_2650.ptr_,local_2650.capacity_);
    }
    std::__cxx11::string::operator=((string *)&local_2690,(string *)local_26b0);
    if (local_26b0[0] != local_26a0) {
      operator_delete(local_26b0[0],local_26a0[0] + 1);
    }
    send_to_char(local_2690,ch);
    send_to_char("The following climates are available:\n\r",ch);
    lVar3 = 0;
    uVar4 = 0;
    do {
      if (*(long *)((long)(climate_table[0].skyfreqs + -1) + 8 + lVar3) == 0) {
        if (0x55555555 < (uint)((int)uVar4 * -0x55555555)) {
          send_to_char("\n\r",ch);
        }
        break;
      }
      sprintf(local_1238,"%s ");
      if ((char)((char)uVar4 + (char)(uVar4 / 3) * -3) == '\0') {
        local_2650.size_ = 0;
        local_2650._vptr_buffer = local_2670;
        local_2650.ptr_ = local_2630;
        local_2650.capacity_ = 500;
        fmt_00.size_ = 4;
        fmt_00.data_ = "{}\n\r";
        args_00.field_1.values_ =
             (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_2668;
        args_00.desc_ = 0xc;
        local_2668[0] = local_1238;
        ::fmt::v9::detail::vformat_to<char>(&local_2650,fmt_00,args_00,(locale_ref)0x0);
        local_26b0[0] = local_26a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_26b0,local_2650.ptr_,local_2650.ptr_ + local_2650.size_);
        if (local_2650.ptr_ != local_2630) {
          operator_delete(local_2650.ptr_,local_2650.capacity_);
        }
        std::__cxx11::string::operator=((string *)&local_2690,(string *)local_26b0);
        if (local_26b0[0] != local_26a0) {
          operator_delete(local_26b0[0],local_26a0[0] + 1);
        }
      }
      send_to_char(local_2690,ch);
      uVar4 = (ulong)((int)uVar4 + 1);
      lVar3 = lVar3 + 0x78;
    } while (lVar3 != 0x438);
  }
  else {
    *(short *)((long)pvVar1 + 0x158) = (short)iVar2;
    send_to_char("Climate set.\n\r",ch);
  }
  if (local_2690 != &local_2680) {
    operator_delete(local_2690,CONCAT71(uStack_267f,local_2680) + 1);
  }
  return -1 < iVar2;
}

Assistant:

bool aedit_climate(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	std::string buffer;
	char wcli[MSL];
	char hold[MSL];
	int icli = 0, climate;

	EDIT_AREA(ch, pArea);

	one_argument(argument, wcli);

	icli = aclimate_lookup(wcli);

	if (icli < 0)
	{
		buffer = fmt::format("{} is not a valid climate.\n\r", wcli);
		send_to_char(buffer.c_str(), ch);
		send_to_char("The following climates are available:\n\r", ch);

		for (climate = 0; climate < Climate::MaxClimate; climate++)
		{
			if (climate_table[climate].name == nullptr)
				break;

			sprintf(hold, "%s ", climate_table[climate].name);

			if (climate % 3 == 0)
				buffer = fmt::format("{}\n\r", hold);

			send_to_char(buffer.c_str(), ch);
		}

		if (climate % 3 != 0)
			send_to_char("\n\r", ch);

		return false;
	}
	else
	{
		pArea->climate = icli;
		send_to_char("Climate set.\n\r", ch);
		return true;
	}
}